

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O2

void __thiscall chrono::ChArchiveOut::ChArchiveOut(ChArchiveOut *this)

{
  mapped_type *pmVar1;
  key_type local_30;
  
  ChArchive::ChArchive(&this->super_ChArchive);
  (this->super_ChArchive)._vptr_ChArchive = (_func_int **)&PTR__ChArchiveOut_001587f8;
  (this->internal_ptr_id)._M_h._M_buckets = &(this->internal_ptr_id)._M_h._M_single_bucket;
  (this->internal_ptr_id)._M_h._M_bucket_count = 1;
  (this->internal_ptr_id)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->internal_ptr_id)._M_h._M_element_count = 0;
  (this->internal_ptr_id)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->internal_ptr_id)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->internal_ptr_id)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->external_ptr_id)._M_h._M_buckets = &(this->external_ptr_id)._M_h._M_single_bucket;
  (this->external_ptr_id)._M_h._M_bucket_count = 1;
  (this->external_ptr_id)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->external_ptr_id)._M_h._M_element_count = 0;
  (this->external_ptr_id)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->external_ptr_id)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->external_ptr_id)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->cut_pointers)._M_h._M_buckets = &(this->cut_pointers)._M_h._M_single_bucket;
  (this->cut_pointers)._M_h._M_bucket_count = 1;
  (this->cut_pointers)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->cut_pointers)._M_h._M_element_count = 0;
  (this->cut_pointers)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->cut_pointers)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->cut_pointers)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->cut_all_pointers = false;
  std::
  _Hashtable<void_*,_std::pair<void_*const,_unsigned_long>,_std::allocator<std::pair<void_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->internal_ptr_id)._M_h);
  local_30 = (key_type)0x0;
  pmVar1 = std::__detail::
           _Map_base<void_*,_std::pair<void_*const,_unsigned_long>,_std::allocator<std::pair<void_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<void_*,_std::pair<void_*const,_unsigned_long>,_std::allocator<std::pair<void_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->internal_ptr_id,&local_30);
  *pmVar1 = 0;
  this->currentID = 0;
  return;
}

Assistant:

ChArchiveOut() {

            cut_all_pointers = false;

            internal_ptr_id.clear();
            internal_ptr_id[0]=(0);  // ID=0 -> null pointer.
            currentID = 0;
        }